

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopSnapshot(cmMakefile *this,bool reportError)

{
  cmStateSnapshot *this_00;
  bool bVar1;
  allocator local_51;
  string local_50;
  
  this_00 = &this->StateSnapshot;
  while( true ) {
    bVar1 = cmStateSnapshot::CanPopPolicyScope(this_00);
    if (bVar1) break;
    if ((reportError & 1U) != 0) {
      std::__cxx11::string::string
                ((string *)&local_50,"cmake_policy PUSH without matching POP",&local_51);
      IssueMessage(this,FATAL_ERROR,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    PopPolicy(this);
    reportError = false;
  }
  cmState::Pop((cmStateSnapshot *)&local_50,this->GlobalGenerator->CMakeInstance->State,this_00);
  (this->StateSnapshot).Position.Position = local_50.field_2._M_allocated_capacity;
  this_00->State = (cmState *)local_50._M_dataplus._M_p;
  (this->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_50._M_string_length;
  bVar1 = cmStateSnapshot::IsValid(this_00);
  if (bVar1) {
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmMakefile.cxx"
                ,0xfef,"void cmMakefile::PopSnapshot(bool)");
}

Assistant:

void cmMakefile::PopSnapshot(bool reportError)
{
  // cmStateSnapshot manages nested policy scopes within it.
  // Since the scope corresponding to the snapshot is closing,
  // reject any still-open nested policy scopes with an error.
  while (!this->StateSnapshot.CanPopPolicyScope()) {
    if (reportError) {
      this->IssueMessage(cmake::FATAL_ERROR,
                         "cmake_policy PUSH without matching POP");
      reportError = false;
    }
    this->PopPolicy();
  }

  this->StateSnapshot = this->GetState()->Pop(this->StateSnapshot);
  assert(this->StateSnapshot.IsValid());
}